

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  allocator local_6c1;
  string local_6c0;
  allocator local_699;
  string local_698;
  CodeGenerator local_678;
  Generator js_generator;
  string local_668;
  allocator local_641;
  string local_640;
  allocator local_619;
  string local_618;
  CodeGenerator local_5f8;
  ObjectiveCGenerator objc_generator;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  allocator local_599;
  string local_598;
  CodeGenerator local_578;
  Generator csharp_generator;
  string local_568;
  allocator local_541;
  string local_540;
  CodeGenerator local_520;
  Generator rb_generator;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  CodeGenerator local_4c8;
  Generator php_generator;
  string local_4b8;
  allocator local_491;
  string local_490;
  CodeGenerator local_470;
  JavaNanoGenerator javanano_generator;
  string local_460;
  allocator local_439;
  string local_438;
  undefined1 local_418 [8];
  Generator py_generator;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  CodeGenerator local_360;
  JavaGenerator java_generator;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  CodeGenerator local_2e0;
  CppGenerator cpp_generator;
  allocator local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  CommandLineInterface cli;
  char **argv_local;
  int argc_local;
  
  cli._640_8_ = argv;
  google::protobuf::compiler::CommandLineInterface::CommandLineInterface
            ((CommandLineInterface *)local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"protoc-",&local_2c1);
  google::protobuf::compiler::CommandLineInterface::AllowPlugins
            ((CommandLineInterface *)local_2a0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  google::protobuf::compiler::cpp::CppGenerator::CppGenerator((CppGenerator *)&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"--cpp_out",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"--cpp_opt",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_350,"Generate C++ header and source.",
             (allocator *)((long)&java_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_300,&local_328,&local_2e0,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&java_generator.super_CodeGenerator._vptr_CodeGenerator + 7))
  ;
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  google::protobuf::compiler::java::JavaGenerator::JavaGenerator((JavaGenerator *)&local_360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"--java_out",&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"--java_opt",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d0,"Generate Java source file.",
             (allocator *)((long)&py_generator.printer_ + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_380,&local_3a8,&local_360,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&py_generator.printer_ + 7));
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  google::protobuf::compiler::python::Generator::Generator((Generator *)local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"--python_out",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_460,"Generate Python source file.",
             (allocator *)((long)&javanano_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_438,(CodeGenerator *)local_418,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&javanano_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  google::protobuf::compiler::javanano::JavaNanoGenerator::JavaNanoGenerator
            ((JavaNanoGenerator *)&local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"--javanano_out",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b8,"Generate Java Nano source file.",
             (allocator *)((long)&php_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_490,&local_470,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&php_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  google::protobuf::compiler::php::Generator::Generator((Generator *)&local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"--php_out",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_510,"Generate PHP source file.",
             (allocator *)((long)&rb_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_4e8,&local_4c8,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&rb_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  google::protobuf::compiler::ruby::Generator::Generator((Generator *)&local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"--ruby_out",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_568,"Generate Ruby source file.",
             (allocator *)((long)&csharp_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_540,&local_520,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&csharp_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  google::protobuf::compiler::csharp::Generator::Generator((Generator *)&local_578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,"--csharp_out",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"--csharp_opt",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5e8,"Generate C# source file.",
             (allocator *)((long)&objc_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_598,&local_5c0,&local_578,&local_5e8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&objc_generator.super_CodeGenerator._vptr_CodeGenerator + 7))
  ;
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  google::protobuf::compiler::objectivec::ObjectiveCGenerator::ObjectiveCGenerator
            ((ObjectiveCGenerator *)&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,"--objc_out",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"--objc_opt",&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_668,"Generate Objective C header and source.",
             (allocator *)((long)&js_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_618,&local_640,&local_5f8,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&js_generator.super_CodeGenerator._vptr_CodeGenerator + 7));
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  google::protobuf::compiler::js::Generator::Generator((Generator *)&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"--js_out",&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"Generate JavaScript source.",&local_6c1);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            ((CommandLineInterface *)local_2a0,&local_698,&local_678,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  iVar1 = google::protobuf::compiler::CommandLineInterface::Run
                    ((CommandLineInterface *)local_2a0,argc,(char **)cli._640_8_);
  google::protobuf::compiler::js::Generator::~Generator((Generator *)&local_678);
  google::protobuf::compiler::objectivec::ObjectiveCGenerator::~ObjectiveCGenerator
            ((ObjectiveCGenerator *)&local_5f8);
  google::protobuf::compiler::csharp::Generator::~Generator((Generator *)&local_578);
  google::protobuf::compiler::ruby::Generator::~Generator((Generator *)&local_520);
  google::protobuf::compiler::php::Generator::~Generator((Generator *)&local_4c8);
  google::protobuf::compiler::javanano::JavaNanoGenerator::~JavaNanoGenerator
            ((JavaNanoGenerator *)&local_470);
  google::protobuf::compiler::python::Generator::~Generator((Generator *)local_418);
  google::protobuf::compiler::java::JavaGenerator::~JavaGenerator((JavaGenerator *)&local_360);
  google::protobuf::compiler::cpp::CppGenerator::~CppGenerator((CppGenerator *)&local_2e0);
  google::protobuf::compiler::CommandLineInterface::~CommandLineInterface
            ((CommandLineInterface *)local_2a0);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {

  google::protobuf::compiler::CommandLineInterface cli;
  cli.AllowPlugins("protoc-");

  // Proto2 C++
  google::protobuf::compiler::cpp::CppGenerator cpp_generator;
  cli.RegisterGenerator("--cpp_out", "--cpp_opt", &cpp_generator,
                        "Generate C++ header and source.");

#ifndef OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP
  // Proto2 Java
  google::protobuf::compiler::java::JavaGenerator java_generator;
  cli.RegisterGenerator("--java_out", "--java_opt", &java_generator,
                        "Generate Java source file.");
#endif  // !OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP


#ifndef OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP
  // Proto2 Python
  google::protobuf::compiler::python::Generator py_generator;
  cli.RegisterGenerator("--python_out", &py_generator,
                        "Generate Python source file.");

  // Java Nano
  google::protobuf::compiler::javanano::JavaNanoGenerator javanano_generator;
  cli.RegisterGenerator("--javanano_out", &javanano_generator,
                        "Generate Java Nano source file.");

  // PHP
  google::protobuf::compiler::php::Generator php_generator;
  cli.RegisterGenerator("--php_out", &php_generator,
                        "Generate PHP source file.");

  // Ruby
  google::protobuf::compiler::ruby::Generator rb_generator;
  cli.RegisterGenerator("--ruby_out", &rb_generator,
                        "Generate Ruby source file.");

  // CSharp
  google::protobuf::compiler::csharp::Generator csharp_generator;
  cli.RegisterGenerator("--csharp_out", "--csharp_opt", &csharp_generator,
                        "Generate C# source file.");

  // Objective C
  google::protobuf::compiler::objectivec::ObjectiveCGenerator objc_generator;
  cli.RegisterGenerator("--objc_out", "--objc_opt", &objc_generator,
                        "Generate Objective C header and source.");

  // JavaScript
  google::protobuf::compiler::js::Generator js_generator;
  cli.RegisterGenerator("--js_out", &js_generator,
                        "Generate JavaScript source.");
#endif  // !OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP

  return cli.Run(argc, argv);
}